

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall google::protobuf::internal::ExtensionSet::NumExtensions(ExtensionSet *this)

{
  int local_14;
  ExtensionSet *pEStack_10;
  int result;
  ExtensionSet *this_local;
  
  local_14 = 0;
  pEStack_10 = this;
  ForEachNoPrefetch<google::protobuf::internal::ExtensionSet::NumExtensions()const::__0>
            (this,(anon_class_8_1_6971b95b)&local_14);
  return local_14;
}

Assistant:

int ExtensionSet::NumExtensions() const {
  int result = 0;
  ForEachNoPrefetch([&result](int /* number */, const Extension& ext) {
    if (!ext.is_cleared) {
      ++result;
    }
  });
  return result;
}